

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerException.cpp
# Opt level: O0

void __thiscall
ninx::lexer::exception::LexerException::LexerException
          (LexerException *this,int line,string *origin,string *message)

{
  string local_48;
  string *local_28;
  string *message_local;
  string *origin_local;
  LexerException *pLStack_10;
  int line_local;
  LexerException *this_local;
  
  local_28 = message;
  message_local = origin;
  origin_local._4_4_ = line;
  pLStack_10 = this;
  make_message(&local_48,line,origin,message);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)this = &PTR__LexerException_00288818;
  this->line = origin_local._4_4_;
  this->origin = message_local;
  return;
}

Assistant:

ninx::lexer::exception::LexerException::LexerException(int line, std::string &origin, const std::string &message)
        : runtime_error(
        make_message(line, origin, message)), line{line}, origin(origin) {

}